

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMvIntersector1Woop<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Geometry *pGVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  StackItemT<embree::NodeRefPtr<8>_> *pSVar22;
  uint uVar23;
  long lVar24;
  byte bVar25;
  ulong uVar26;
  ulong uVar27;
  StackItemT<embree::NodeRefPtr<8>_> *pSVar28;
  ulong uVar29;
  byte bVar30;
  byte bVar31;
  uint uVar32;
  uint uVar33;
  undefined1 (*pauVar34) [16];
  size_t sVar35;
  ulong uVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined4 uVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  long lStack_2670;
  int local_2634;
  ulong local_2630;
  ulong local_2628;
  ulong local_2620;
  RTCIntersectArguments *local_2618;
  long local_2610;
  ulong local_2608;
  RayQueryContext *local_2600;
  Scene *local_25f8;
  long local_25f0;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  float local_2588;
  float local_24b8 [4];
  float local_24a8 [4];
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  undefined1 local_2478 [16];
  undefined1 local_2468 [16];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr != 8) {
    local_2600 = context;
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar42._8_4_ = 0x7fffffff;
    auVar42._0_8_ = 0x7fffffff7fffffff;
    auVar42._12_4_ = 0x7fffffff;
    auVar38 = vpandd_avx512vl((undefined1  [16])aVar2,auVar42);
    auVar39 = vprolq_avx512vl(auVar38,0x20);
    auVar40 = vshufps_avx(auVar38,auVar38,0x4e);
    auVar42 = vmaxss_avx(auVar38,auVar39);
    uVar23 = 2;
    if (auVar40._0_4_ < auVar42._0_4_) {
      uVar23 = (uint)(auVar38._0_4_ <= auVar39._0_4_);
    }
    uVar32 = uVar23 - 2;
    if (uVar23 + 1 < 3) {
      uVar32 = uVar23 + 1;
    }
    uVar33 = uVar32 + 1;
    if (uVar32 + 1 == 3) {
      uVar33 = 0;
    }
    local_2628 = (ulong)uVar23;
    fVar1 = (float)ray->instID[local_2628 - 0xf];
    uVar23 = uVar32;
    if (fVar1 < 0.0) {
      uVar23 = uVar33;
    }
    local_2630 = (ulong)uVar23;
    if (fVar1 < 0.0) {
      uVar33 = uVar32;
    }
    local_2620 = (ulong)uVar33;
    uVar23 = ray->instID[local_2630 - 0x13];
    auVar72 = ZEXT1664(CONCAT412(uVar23,CONCAT48(uVar23,CONCAT44(uVar23,uVar23))));
    uVar23 = ray->instID[local_2620 - 0x13];
    auVar73 = ZEXT1664(CONCAT412(uVar23,CONCAT48(uVar23,CONCAT44(uVar23,uVar23))));
    uVar23 = ray->instID[local_2628 - 0x13];
    auVar75 = ZEXT1664(CONCAT412(uVar23,CONCAT48(uVar23,CONCAT44(uVar23,uVar23))));
    auVar76 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar40 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,ZEXT416(ray->instID[local_2628 - 0xf]));
    auVar42 = vfnmadd213ss_fma(ZEXT416((uint)fVar1),auVar40,ZEXT416(0x40000000));
    fVar1 = auVar40._0_4_ * auVar42._0_4_;
    pSVar28 = stack + 1;
    stack[0].dist = 0;
    auVar42 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar40 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar41._8_4_ = 0x219392ef;
    auVar41._0_8_ = 0x219392ef219392ef;
    auVar41._12_4_ = 0x219392ef;
    uVar26 = vcmpps_avx512vl(auVar38,auVar41,1);
    bVar37 = (bool)((byte)uVar26 & 1);
    auVar39._0_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * (int)aVar2.x;
    bVar37 = (bool)((byte)(uVar26 >> 1) & 1);
    auVar39._4_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * (int)aVar2.y;
    bVar37 = (bool)((byte)(uVar26 >> 2) & 1);
    auVar39._8_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * (int)aVar2.z;
    bVar37 = (bool)((byte)(uVar26 >> 3) & 1);
    auVar39._12_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * aVar2.field_3.a;
    auVar41 = vrcp14ps_avx512vl(auVar39);
    auVar38._8_4_ = 0x3f800000;
    auVar38._0_8_ = 0x3f8000003f800000;
    auVar38._12_4_ = 0x3f800000;
    auVar38 = vfnmadd213ps_avx512vl(auVar39,auVar41,auVar38);
    auVar41 = vfmadd132ps_fma(auVar38,auVar41,auVar41);
    auVar48 = vbroadcastss_avx512vl(auVar41);
    auVar77 = ZEXT3264(auVar48);
    auVar38 = vmovshdup_avx(auVar41);
    auVar48 = vbroadcastsd_avx512vl(auVar38);
    auVar78 = ZEXT3264(auVar48);
    auVar52._8_4_ = 2;
    auVar52._0_8_ = 0x200000002;
    auVar52._12_4_ = 2;
    auVar52._16_4_ = 2;
    auVar52._20_4_ = 2;
    auVar52._24_4_ = 2;
    auVar52._28_4_ = 2;
    auVar39 = vshufpd_avx(auVar41,auVar41,1);
    auVar48 = vpermps_avx512vl(auVar52,ZEXT1632(auVar41));
    auVar79 = ZEXT3264(auVar48);
    fVar58 = auVar41._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar48 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar80 = ZEXT3264(auVar48);
    auVar53._4_4_ = fVar58;
    auVar53._0_4_ = fVar58;
    auVar53._8_4_ = fVar58;
    auVar53._12_4_ = fVar58;
    auVar53._16_4_ = fVar58;
    auVar53._20_4_ = fVar58;
    auVar53._24_4_ = fVar58;
    auVar53._28_4_ = fVar58;
    auVar50 = ZEXT1632(CONCAT412(auVar41._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar41._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar41._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar58))
                                ));
    auVar49 = vpermps_avx512vl(auVar48,auVar50);
    auVar48 = vpermps_avx2(auVar52,auVar50);
    uVar26 = (ulong)(auVar41._0_4_ < 0.0) * 0x20;
    uVar36 = (ulong)(auVar38._0_4_ < 0.0) << 5 | 0x40;
    uVar29 = (ulong)(auVar39._0_4_ < 0.0) << 5 | 0x80;
    uVar69 = auVar40._0_4_;
    auVar62 = ZEXT3264(CONCAT428(uVar69,CONCAT424(uVar69,CONCAT420(uVar69,CONCAT416(uVar69,CONCAT412
                                                  (uVar69,CONCAT48(uVar69,CONCAT44(uVar69,uVar69))))
                                                  ))));
    auVar51._8_4_ = 0x80000000;
    auVar51._0_8_ = 0x8000000080000000;
    auVar51._12_4_ = 0x80000000;
    auVar51._16_4_ = 0x80000000;
    auVar51._20_4_ = 0x80000000;
    auVar51._24_4_ = 0x80000000;
    auVar51._28_4_ = 0x80000000;
    auVar50 = vxorps_avx512vl(auVar53,auVar51);
    auVar81 = ZEXT3264(auVar50);
    auVar49 = vxorps_avx512vl(auVar49,auVar51);
    auVar82 = ZEXT3264(auVar49);
    auVar48 = vxorps_avx512vl(auVar48,auVar51);
    auVar83 = ZEXT3264(auVar48);
    auVar48 = vbroadcastss_avx512vl(auVar42);
    auVar84 = ZEXT3264(auVar48);
    auVar42 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar1 * (float)ray->instID[local_2630 - 0xf])));
    auVar85 = ZEXT1664(auVar42);
    auVar42 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar1 * (float)ray->instID[local_2620 - 0xf])));
    auVar86 = ZEXT1664(auVar42);
    auVar42 = vbroadcastss_avx512vl(ZEXT416((uint)fVar1));
    auVar87 = ZEXT1664(auVar42);
    auVar48 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar88 = ZEXT3264(auVar48);
    auVar48 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar89 = ZEXT3264(auVar48);
    auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
    auVar90 = ZEXT1664(auVar42);
    auVar48 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
    auVar91 = ZEXT3264(auVar48);
    auVar48 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
    auVar93 = ZEXT3264(auVar48);
LAB_01c5dc67:
    if (pSVar28 != stack) {
      pSVar22 = pSVar28 + -1;
      pSVar28 = pSVar28 + -1;
      if ((float)pSVar22->dist <= (ray->super_RayK<1>).tfar) {
        sVar35 = (pSVar28->ptr).ptr;
LAB_01c5dc8c:
        do {
          if ((sVar35 & 8) != 0) goto LAB_01c5e000;
          auVar48 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar35 + 0x40 + uVar26),auVar81._0_32_,
                               auVar77._0_32_);
          auVar49 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar35 + 0x40 + uVar36),auVar82._0_32_,
                               auVar78._0_32_);
          auVar48 = vpmaxsd_avx2(auVar48,auVar49);
          auVar49 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar35 + 0x40 + uVar29),auVar83._0_32_,
                               auVar79._0_32_);
          auVar49 = vpmaxsd_avx512vl(auVar49,auVar84._0_32_);
          auVar48 = vpmaxsd_avx2(auVar48,auVar49);
          auVar49 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar35 + 0x40 + (uVar26 ^ 0x20)),
                               auVar81._0_32_,auVar77._0_32_);
          auVar50 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar35 + 0x40 + (uVar36 ^ 0x20)),
                               auVar82._0_32_,auVar78._0_32_);
          auVar49 = vpminsd_avx2(auVar49,auVar50);
          auVar50 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(sVar35 + 0x40 + (uVar29 ^ 0x20)),
                               auVar83._0_32_,auVar79._0_32_);
          auVar50 = vpminsd_avx2(auVar50,auVar62._0_32_);
          auVar49 = vpminsd_avx2(auVar49,auVar50);
          uVar27 = vpcmpd_avx512vl(auVar48,auVar49,2);
          bVar30 = (byte)uVar27;
          if (bVar30 == 0) break;
          auVar49 = *(undefined1 (*) [32])(sVar35 & 0xfffffffffffffff0);
          auVar50 = ((undefined1 (*) [32])(sVar35 & 0xfffffffffffffff0))[1];
          auVar51 = vmovdqa64_avx512vl(auVar88._0_32_);
          auVar51 = vpternlogd_avx512vl(auVar51,auVar48,auVar89._0_32_,0xf8);
          auVar52 = vpcompressd_avx512vl(auVar51);
          auVar55._0_4_ =
               (uint)(bVar30 & 1) * auVar52._0_4_ | (uint)!(bool)(bVar30 & 1) * auVar51._0_4_;
          bVar37 = (bool)((byte)(uVar27 >> 1) & 1);
          auVar55._4_4_ = (uint)bVar37 * auVar52._4_4_ | (uint)!bVar37 * auVar51._4_4_;
          bVar37 = (bool)((byte)(uVar27 >> 2) & 1);
          auVar55._8_4_ = (uint)bVar37 * auVar52._8_4_ | (uint)!bVar37 * auVar51._8_4_;
          bVar37 = (bool)((byte)(uVar27 >> 3) & 1);
          auVar55._12_4_ = (uint)bVar37 * auVar52._12_4_ | (uint)!bVar37 * auVar51._12_4_;
          bVar37 = (bool)((byte)(uVar27 >> 4) & 1);
          auVar55._16_4_ = (uint)bVar37 * auVar52._16_4_ | (uint)!bVar37 * auVar51._16_4_;
          bVar37 = (bool)((byte)(uVar27 >> 5) & 1);
          auVar55._20_4_ = (uint)bVar37 * auVar52._20_4_ | (uint)!bVar37 * auVar51._20_4_;
          bVar37 = (bool)((byte)(uVar27 >> 6) & 1);
          auVar55._24_4_ = (uint)bVar37 * auVar52._24_4_ | (uint)!bVar37 * auVar51._24_4_;
          bVar37 = SUB81(uVar27 >> 7,0);
          auVar55._28_4_ = (uint)bVar37 * auVar52._28_4_ | (uint)!bVar37 * auVar51._28_4_;
          auVar51 = vpermt2q_avx512vl(auVar49,auVar55,auVar50);
          sVar35 = auVar51._0_8_;
          bVar30 = bVar30 - 1 & bVar30;
          if (bVar30 != 0) {
            auVar51 = vpshufd_avx2(auVar55,0x55);
            vpermt2q_avx512vl(auVar49,auVar51,auVar50);
            auVar52 = vpminsd_avx2(auVar55,auVar51);
            auVar51 = vpmaxsd_avx2(auVar55,auVar51);
            bVar30 = bVar30 - 1 & bVar30;
            if (bVar30 == 0) {
              auVar52 = vpermi2q_avx512vl(auVar52,auVar49,auVar50);
              sVar35 = auVar52._0_8_;
              auVar49 = vpermt2q_avx512vl(auVar49,auVar51,auVar50);
              (pSVar28->ptr).ptr = auVar49._0_8_;
              lVar24 = 8;
              lStack_2670 = 0x10;
            }
            else {
              auVar57 = vpshufd_avx2(auVar55,0xaa);
              vpermt2q_avx512vl(auVar49,auVar57,auVar50);
              auVar53 = vpminsd_avx2(auVar52,auVar57);
              auVar52 = vpmaxsd_avx2(auVar52,auVar57);
              auVar57 = vpminsd_avx2(auVar51,auVar52);
              auVar52 = vpmaxsd_avx2(auVar51,auVar52);
              bVar30 = bVar30 - 1 & bVar30;
              if (bVar30 == 0) {
                auVar51 = vpermi2q_avx512vl(auVar53,auVar49,auVar50);
                sVar35 = auVar51._0_8_;
                auVar51 = vpermt2q_avx512vl(auVar49,auVar52,auVar50);
                (pSVar28->ptr).ptr = auVar51._0_8_;
                auVar51 = vpermd_avx2(auVar52,auVar48);
                pSVar28->dist = auVar51._0_4_;
                auVar49 = vpermt2q_avx512vl(auVar49,auVar57,auVar50);
                pSVar28[1].ptr.ptr = auVar49._0_8_;
                lStack_2670 = 0x18;
                lVar24 = lStack_2670;
                lStack_2670 = 0x20;
                auVar51 = auVar57;
              }
              else {
                auVar51 = vpshufd_avx2(auVar55,0xff);
                vpermt2q_avx512vl(auVar49,auVar51,auVar50);
                auVar92 = vpminsd_avx2(auVar53,auVar51);
                auVar53 = vpmaxsd_avx2(auVar53,auVar51);
                auVar51 = vpminsd_avx2(auVar57,auVar53);
                auVar53 = vpmaxsd_avx2(auVar57,auVar53);
                auVar57 = vpminsd_avx2(auVar52,auVar53);
                auVar52 = vpmaxsd_avx2(auVar52,auVar53);
                bVar30 = bVar30 - 1 & bVar30;
                if (bVar30 != 0) {
                  auVar54 = valignd_avx512vl(auVar55,auVar55,3);
                  auVar53 = vmovdqa64_avx512vl(auVar90._0_32_);
                  auVar55 = vmovdqa64_avx512vl(auVar90._0_32_);
                  auVar56 = vmovdqa64_avx512vl(auVar91._0_32_);
                  auVar55 = vpermt2d_avx512vl(auVar55,auVar91._0_32_,auVar92);
                  auVar92 = auVar93._0_32_;
                  auVar51 = vpermt2d_avx512vl(auVar55,auVar92,auVar51);
                  auVar55 = vmovdqa64_avx512vl(auVar92);
                  auVar57 = vpermt2d_avx512vl(auVar51,auVar92,auVar57);
                  auVar51 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar51 = vpermt2d_avx512vl(auVar57,auVar51,auVar52);
                  auVar76 = ZEXT3264(auVar51);
                  bVar25 = bVar30;
                  do {
                    auVar52 = auVar76._0_32_;
                    auVar51 = vpermps_avx512vl(auVar80._0_32_,auVar54);
                    auVar54 = valignd_avx512vl(auVar54,auVar54,1);
                    vpermt2q_avx512vl(auVar49,auVar54,auVar50);
                    bVar25 = bVar25 - 1 & bVar25;
                    uVar19 = vpcmpd_avx512vl(auVar51,auVar52,5);
                    auVar51 = vpmaxsd_avx2(auVar51,auVar52);
                    bVar31 = (byte)uVar19 << 1;
                    auVar52 = valignd_avx512vl(auVar52,auVar52,7);
                    bVar37 = (bool)((byte)uVar19 & 1);
                    bVar6 = (bool)(bVar31 >> 2 & 1);
                    bVar7 = (bool)(bVar31 >> 3 & 1);
                    bVar8 = (bool)(bVar31 >> 4 & 1);
                    bVar9 = (bool)(bVar31 >> 5 & 1);
                    bVar10 = (bool)(bVar31 >> 6 & 1);
                    auVar76 = ZEXT3264(CONCAT428((uint)(bVar31 >> 7) * auVar52._28_4_ |
                                                 (uint)!(bool)(bVar31 >> 7) * auVar51._28_4_,
                                                 CONCAT424((uint)bVar10 * auVar52._24_4_ |
                                                           (uint)!bVar10 * auVar51._24_4_,
                                                           CONCAT420((uint)bVar9 * auVar52._20_4_ |
                                                                     (uint)!bVar9 * auVar51._20_4_,
                                                                     CONCAT416((uint)bVar8 *
                                                                               auVar52._16_4_ |
                                                                               (uint)!bVar8 *
                                                                               auVar51._16_4_,
                                                                               CONCAT412((uint)bVar7
                                                                                         * auVar52.
                                                  _12_4_ | (uint)!bVar7 * auVar51._12_4_,
                                                  CONCAT48((uint)bVar6 * auVar52._8_4_ |
                                                           (uint)!bVar6 * auVar51._8_4_,
                                                           CONCAT44((uint)bVar37 * auVar52._4_4_ |
                                                                    (uint)!bVar37 * auVar51._4_4_,
                                                                    auVar51._0_4_))))))));
                  } while (bVar25 != 0);
                  lVar24 = (ulong)(uint)POPCOUNT((uint)bVar30) + 3;
                  while( true ) {
                    auVar52 = auVar76._0_32_;
                    auVar51 = vpermt2q_avx512vl(auVar49,auVar52,auVar50);
                    sVar35 = auVar51._0_8_;
                    bVar37 = lVar24 == 0;
                    lVar24 = lVar24 + -1;
                    if (bVar37) break;
                    (pSVar28->ptr).ptr = sVar35;
                    auVar51 = vpermd_avx2(auVar52,auVar48);
                    pSVar28->dist = auVar51._0_4_;
                    auVar51 = valignd_avx512vl(auVar52,auVar52,1);
                    auVar76 = ZEXT3264(auVar51);
                    pSVar28 = pSVar28 + 1;
                  }
                  auVar76 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar48 = vmovdqa64_avx512vl(auVar53);
                  auVar90 = ZEXT3264(auVar48);
                  auVar48 = vmovdqa64_avx512vl(auVar56);
                  auVar91 = ZEXT3264(auVar48);
                  auVar48 = vmovdqa64_avx512vl(auVar55);
                  auVar93 = ZEXT3264(auVar48);
                  goto LAB_01c5dc8c;
                }
                auVar53 = vpermi2q_avx512vl(auVar92,auVar49,auVar50);
                sVar35 = auVar53._0_8_;
                auVar53 = vpermt2q_avx512vl(auVar49,auVar52,auVar50);
                (pSVar28->ptr).ptr = auVar53._0_8_;
                auVar52 = vpermd_avx2(auVar52,auVar48);
                pSVar28->dist = auVar52._0_4_;
                auVar52 = vpermt2q_avx512vl(auVar49,auVar57,auVar50);
                pSVar28[1].ptr.ptr = auVar52._0_8_;
                auVar52 = vpermd_avx2(auVar57,auVar48);
                pSVar28[1].dist = auVar52._0_4_;
                auVar49 = vpermt2q_avx512vl(auVar49,auVar51,auVar50);
                pSVar28[2].ptr.ptr = auVar49._0_8_;
                lVar24 = 0x28;
                lStack_2670 = 0x30;
              }
            }
            auVar48 = vpermd_avx2(auVar51,auVar48);
            *(int *)((long)&(pSVar28->ptr).ptr + lVar24) = auVar48._0_4_;
            pSVar28 = (StackItemT<embree::NodeRefPtr<8>_> *)
                      ((long)&(pSVar28->ptr).ptr + lStack_2670);
          }
        } while( true );
      }
      goto LAB_01c5dc67;
    }
  }
  return;
LAB_01c5e000:
  local_25f0 = (ulong)((uint)sVar35 & 0xf) - 8;
  for (local_2610 = 0; local_2610 != local_25f0; local_2610 = local_2610 + 1) {
    pauVar34 = (undefined1 (*) [16])(local_2610 * 0xb0 + (sVar35 & 0xfffffffffffffff0));
    auVar43 = auVar72._0_16_;
    auVar42 = vsubps_avx(pauVar34[local_2630],auVar43);
    auVar44 = auVar73._0_16_;
    auVar40 = vsubps_avx(pauVar34[local_2620],auVar44);
    auVar74 = auVar75._0_16_;
    auVar38 = vsubps_avx(pauVar34[local_2628],auVar74);
    auVar39 = vsubps_avx(pauVar34[local_2630 + 3],auVar43);
    auVar41 = vsubps_avx(pauVar34[local_2620 + 3],auVar44);
    auVar45 = vsubps_avx(pauVar34[local_2628 + 3],auVar74);
    auVar43 = vsubps_avx(pauVar34[local_2630 + 6],auVar43);
    auVar44 = vsubps_avx(pauVar34[local_2620 + 6],auVar44);
    auVar74 = vsubps_avx(pauVar34[local_2628 + 6],auVar74);
    auVar59 = auVar85._0_16_;
    auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar38,auVar59);
    auVar63 = auVar86._0_16_;
    auVar40 = vfnmadd231ps_avx512vl(auVar40,auVar38,auVar63);
    auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar45,auVar59);
    auVar41 = vfnmadd231ps_avx512vl(auVar41,auVar45,auVar63);
    auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar74,auVar59);
    auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar74,auVar63);
    auVar59._0_4_ = auVar41._0_4_ * auVar43._0_4_;
    auVar59._4_4_ = auVar41._4_4_ * auVar43._4_4_;
    auVar59._8_4_ = auVar41._8_4_ * auVar43._8_4_;
    auVar59._12_4_ = auVar41._12_4_ * auVar43._12_4_;
    auVar63._0_4_ = auVar39._0_4_ * auVar44._0_4_;
    auVar63._4_4_ = auVar39._4_4_ * auVar44._4_4_;
    auVar63._8_4_ = auVar39._8_4_ * auVar44._8_4_;
    auVar63._12_4_ = auVar39._12_4_ * auVar44._12_4_;
    auVar64._0_4_ = auVar42._0_4_ * auVar44._0_4_;
    auVar64._4_4_ = auVar42._4_4_ * auVar44._4_4_;
    auVar64._8_4_ = auVar42._8_4_ * auVar44._8_4_;
    auVar64._12_4_ = auVar42._12_4_ * auVar44._12_4_;
    auVar44._0_4_ = auVar40._0_4_ * auVar43._0_4_;
    auVar44._4_4_ = auVar40._4_4_ * auVar43._4_4_;
    auVar44._8_4_ = auVar40._8_4_ * auVar43._8_4_;
    auVar44._12_4_ = auVar40._12_4_ * auVar43._12_4_;
    auVar43._0_4_ = auVar40._0_4_ * auVar39._0_4_;
    auVar43._4_4_ = auVar40._4_4_ * auVar39._4_4_;
    auVar43._8_4_ = auVar40._8_4_ * auVar39._8_4_;
    auVar43._12_4_ = auVar40._12_4_ * auVar39._12_4_;
    auVar40._0_4_ = auVar42._0_4_ * auVar41._0_4_;
    auVar40._4_4_ = auVar42._4_4_ * auVar41._4_4_;
    auVar40._8_4_ = auVar42._8_4_ * auVar41._8_4_;
    auVar40._12_4_ = auVar42._12_4_ * auVar41._12_4_;
    uVar19 = vcmpps_avx512vl(auVar59,auVar63,5);
    uVar14 = vcmpps_avx512vl(auVar43,auVar40,5);
    uVar15 = vcmpps_avx512vl(auVar64,auVar44,5);
    uVar16 = vcmpps_avx512vl(auVar59,auVar63,2);
    uVar17 = vcmpps_avx512vl(auVar43,auVar40,2);
    uVar18 = vcmpps_avx512vl(auVar64,auVar44,2);
    bVar30 = ((byte)uVar19 & (byte)uVar14 & (byte)uVar15 |
             (byte)uVar16 & (byte)uVar17 & (byte)uVar18) & 0xf;
    if (bVar30 != 0) {
      auVar42 = vsubps_avx(auVar59,auVar63);
      auVar39 = vsubps_avx(auVar64,auVar44);
      auVar40 = vsubps_avx(auVar43,auVar40);
      auVar65._0_4_ = auVar40._0_4_ + auVar42._0_4_ + auVar39._0_4_;
      auVar65._4_4_ = auVar40._4_4_ + auVar42._4_4_ + auVar39._4_4_;
      auVar65._8_4_ = auVar40._8_4_ + auVar42._8_4_ + auVar39._8_4_;
      auVar65._12_4_ = auVar40._12_4_ + auVar42._12_4_ + auVar39._12_4_;
      uVar19 = vcmpps_avx512vl(auVar65,auVar76._0_16_,4);
      auVar41 = vrcp14ps_avx512vl(auVar65);
      auVar20._8_4_ = 0x3f800000;
      auVar20._0_8_ = 0x3f8000003f800000;
      auVar20._12_4_ = 0x3f800000;
      auVar43 = vfnmadd213ps_avx512vl(auVar65,auVar41,auVar20);
      auVar41 = vfmadd132ps_fma(auVar43,auVar41,auVar41);
      auVar43 = auVar87._0_16_;
      auVar38 = vmulps_avx512vl(auVar43,auVar38);
      auVar45 = vmulps_avx512vl(auVar43,auVar45);
      auVar43 = vmulps_avx512vl(auVar43,auVar74);
      auVar67._0_4_ = auVar40._0_4_ * auVar43._0_4_;
      auVar67._4_4_ = auVar40._4_4_ * auVar43._4_4_;
      auVar67._8_4_ = auVar40._8_4_ * auVar43._8_4_;
      auVar67._12_4_ = auVar40._12_4_ * auVar43._12_4_;
      auVar40 = vfmadd231ps_fma(auVar67,auVar39,auVar45);
      auVar40 = vfmadd231ps_fma(auVar40,auVar42,auVar38);
      fVar58 = auVar41._0_4_;
      local_2498._0_4_ = auVar40._0_4_ * fVar58;
      fVar11 = auVar41._4_4_;
      local_2498._4_4_ = auVar40._4_4_ * fVar11;
      fVar12 = auVar41._8_4_;
      local_2498._8_4_ = auVar40._8_4_ * fVar12;
      fVar13 = auVar41._12_4_;
      local_2498._12_4_ = auVar40._12_4_ * fVar13;
      auVar62 = ZEXT1664(local_2498);
      uVar69 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      auVar45._4_4_ = uVar69;
      auVar45._0_4_ = uVar69;
      auVar45._8_4_ = uVar69;
      auVar45._12_4_ = uVar69;
      uVar14 = vcmpps_avx512vl(local_2498,auVar45,0xe);
      fVar1 = (ray->super_RayK<1>).tfar;
      auVar74._4_4_ = fVar1;
      auVar74._0_4_ = fVar1;
      auVar74._8_4_ = fVar1;
      auVar74._12_4_ = fVar1;
      uVar15 = vcmpps_avx512vl(local_2498,auVar74,2);
      bVar30 = (byte)uVar19 & (byte)uVar14 & (byte)uVar15 & bVar30;
      if (bVar30 != 0) {
        auVar3._0_4_ = (ray->super_RayK<1>).tfar;
        auVar3._4_4_ = (ray->super_RayK<1>).mask;
        auVar3._8_4_ = (ray->super_RayK<1>).id;
        auVar3._12_4_ = (ray->super_RayK<1>).flags;
        auVar71 = ZEXT1664(auVar3);
        uVar23 = vextractps_avx(auVar3,1);
        auVar40 = vsubps_avx(pauVar34[6],*pauVar34);
        auVar38 = vsubps_avx(pauVar34[7],pauVar34[1]);
        auVar41 = vsubps_avx(pauVar34[8],pauVar34[2]);
        auVar45 = vsubps_avx(*pauVar34,pauVar34[3]);
        auVar43 = vsubps_avx(pauVar34[1],pauVar34[4]);
        auVar44 = vsubps_avx(pauVar34[2],pauVar34[5]);
        auVar70._0_4_ = auVar41._0_4_ * auVar43._0_4_;
        auVar70._4_4_ = auVar41._4_4_ * auVar43._4_4_;
        auVar70._8_4_ = auVar41._8_4_ * auVar43._8_4_;
        auVar70._12_4_ = auVar41._12_4_ * auVar43._12_4_;
        local_2488 = vfmsub231ps_fma(auVar70,auVar38,auVar44);
        auVar68._0_4_ = auVar44._0_4_ * auVar40._0_4_;
        auVar68._4_4_ = auVar44._4_4_ * auVar40._4_4_;
        auVar68._8_4_ = auVar44._8_4_ * auVar40._8_4_;
        auVar68._12_4_ = auVar44._12_4_ * auVar40._12_4_;
        local_2478 = vfmsub231ps_fma(auVar68,auVar45,auVar41);
        auVar66._0_4_ = auVar45._0_4_ * auVar38._0_4_;
        auVar66._4_4_ = auVar45._4_4_ * auVar38._4_4_;
        auVar66._8_4_ = auVar45._8_4_ * auVar38._8_4_;
        auVar66._12_4_ = auVar45._12_4_ * auVar38._12_4_;
        local_2468 = vfmsub231ps_fma(auVar66,auVar40,auVar43);
        local_24b8[0] = auVar42._0_4_ * fVar58;
        local_24b8[1] = auVar42._4_4_ * fVar11;
        local_24b8[2] = auVar42._8_4_ * fVar12;
        local_24b8[3] = auVar42._12_4_ * fVar13;
        local_24a8[0] = fVar58 * auVar39._0_4_;
        local_24a8[1] = fVar11 * auVar39._4_4_;
        local_24a8[2] = fVar12 * auVar39._8_4_;
        local_24a8[3] = fVar13 * auVar39._12_4_;
        auVar60._8_4_ = 0x7f800000;
        auVar60._0_8_ = 0x7f8000007f800000;
        auVar60._12_4_ = 0x7f800000;
        auVar42 = vblendmps_avx512vl(auVar60,local_2498);
        auVar46._0_4_ = (uint)(bVar30 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar30 & 1) * 0x7f800000;
        bVar37 = (bool)(bVar30 >> 1 & 1);
        auVar46._4_4_ = (uint)bVar37 * auVar42._4_4_ | (uint)!bVar37 * 0x7f800000;
        bVar37 = (bool)(bVar30 >> 2 & 1);
        auVar46._8_4_ = (uint)bVar37 * auVar42._8_4_ | (uint)!bVar37 * 0x7f800000;
        auVar46._12_4_ =
             (uint)(bVar30 >> 3) * auVar42._12_4_ | (uint)!(bool)(bVar30 >> 3) * 0x7f800000;
        auVar42 = vshufps_avx(auVar46,auVar46,0xb1);
        auVar42 = vminps_avx(auVar42,auVar46);
        auVar40 = vshufpd_avx(auVar42,auVar42,1);
        auVar42 = vminps_avx(auVar40,auVar42);
        uVar19 = vcmpps_avx512vl(auVar46,auVar42,0);
        bVar25 = bVar30;
        if (((byte)uVar19 & bVar30) != 0) {
          bVar25 = (byte)uVar19 & bVar30;
        }
        uVar32 = 0;
        for (uVar33 = (uint)bVar25; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x80000000) {
          uVar32 = uVar32 + 1;
        }
        local_25f8 = local_2600->scene;
        do {
          auVar42 = auVar62._0_16_;
          uVar33 = uVar32 & 0xff;
          h.geomID = *(uint *)(pauVar34[9] + (ulong)uVar33 * 4);
          local_2608 = (ulong)h.geomID;
          pGVar5 = (local_25f8->geometries).items[h.geomID].ptr;
          if ((pGVar5->mask & uVar23) == 0) {
            bVar30 = ~(byte)(1 << (uVar32 & 0x1f)) & bVar30;
          }
          else {
            local_2618 = local_2600->args;
            local_2458 = auVar84._0_32_;
            local_2438 = auVar83._0_32_;
            local_2418 = auVar82._0_32_;
            local_23f8 = auVar81._0_32_;
            local_23d8 = auVar79._0_32_;
            local_23b8 = auVar78._0_32_;
            local_2398 = auVar77._0_32_;
            if (local_2600->args->filter == (RTCFilterFunctionN)0x0) {
              args.context = local_2600->user;
              if (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                uVar27 = (ulong)(uVar33 << 2);
                fVar1 = *(float *)((long)local_24b8 + uVar27);
                fVar58 = *(float *)((long)local_24a8 + uVar27);
                (ray->super_RayK<1>).tfar = *(float *)(local_2498 + uVar27);
                (ray->Ng).field_0.field_0.x = *(float *)(local_2488 + uVar27);
                (ray->Ng).field_0.field_0.y = *(float *)(local_2478 + uVar27);
                (ray->Ng).field_0.field_0.z = *(float *)(local_2468 + uVar27);
                ray->u = fVar1;
                ray->v = fVar58;
                ray->primID = *(uint *)(pauVar34[10] + uVar27);
                ray->geomID = h.geomID;
                ray->instID[0] = (args.context)->instID[0];
                ray->instPrimID[0] = (args.context)->instPrimID[0];
                break;
              }
            }
            else {
              args.context = local_2600->user;
            }
            uVar27 = (ulong)(uVar33 * 4);
            h.Ng.field_0.field_0.x = *(float *)(local_2488 + uVar27);
            h.Ng.field_0.field_0.y = *(float *)(local_2478 + uVar27);
            h.Ng.field_0.field_0.z = *(float *)(local_2468 + uVar27);
            h.u = *(float *)((long)local_24b8 + uVar27);
            h.v = *(float *)((long)local_24a8 + uVar27);
            h.primID = *(uint *)(pauVar34[10] + uVar27);
            h.instID[0] = (args.context)->instID[0];
            h.instPrimID[0] = (args.context)->instPrimID[0];
            (ray->super_RayK<1>).tfar = *(float *)(local_2498 + uVar27);
            local_2634 = -1;
            args.valid = &local_2634;
            args.geometryUserPtr = pGVar5->userPtr;
            args.ray = (RTCRayN *)ray;
            args.hit = (RTCHitN *)&h;
            args.N = 1;
            if (((pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                ((*pGVar5->intersectionFilterN)(&args), *args.valid != 0)) &&
               ((local_2618->filter == (RTCFilterFunctionN)0x0 ||
                ((((local_2618->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                   RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar5->field_8).field_0x2 & 0x40) == 0)) ||
                 ((*local_2618->filter)(&args), *args.valid != 0)))))) {
              *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
              *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
              *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
              *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
              *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
              *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
              *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
              *(undefined4 *)(args.ray + 0x4c) = *(undefined4 *)(args.hit + 0x1c);
              *(undefined4 *)(args.ray + 0x50) = *(undefined4 *)(args.hit + 0x20);
            }
            else {
              local_2588 = auVar71._0_4_;
              (ray->super_RayK<1>).tfar = local_2588;
            }
            auVar4._0_4_ = (ray->super_RayK<1>).tfar;
            auVar4._4_4_ = (ray->super_RayK<1>).mask;
            auVar4._8_4_ = (ray->super_RayK<1>).id;
            auVar4._12_4_ = (ray->super_RayK<1>).flags;
            auVar71 = ZEXT1664(auVar4);
            auVar62 = ZEXT1664(auVar42);
            fVar1 = (ray->super_RayK<1>).tfar;
            auVar21._4_4_ = fVar1;
            auVar21._0_4_ = fVar1;
            auVar21._8_4_ = fVar1;
            auVar21._12_4_ = fVar1;
            uVar19 = vcmpps_avx512vl(auVar42,auVar21,2);
            bVar30 = ~(byte)(1 << (uVar32 & 0x1f)) & bVar30 & (byte)uVar19;
            uVar23 = vextractps_avx(auVar4,1);
            auVar72 = ZEXT1664(auVar72._0_16_);
            auVar73 = ZEXT1664(auVar73._0_16_);
            auVar75 = ZEXT1664(auVar75._0_16_);
            auVar76 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar77 = ZEXT3264(local_2398);
            auVar78 = ZEXT3264(local_23b8);
            auVar79 = ZEXT3264(local_23d8);
            auVar48 = vbroadcastss_avx512vl(ZEXT416(1));
            auVar80 = ZEXT3264(auVar48);
            auVar81 = ZEXT3264(local_23f8);
            auVar82 = ZEXT3264(local_2418);
            auVar83 = ZEXT3264(local_2438);
            auVar84 = ZEXT3264(local_2458);
            auVar85 = ZEXT1664(auVar85._0_16_);
            auVar86 = ZEXT1664(auVar86._0_16_);
            auVar87 = ZEXT1664(auVar87._0_16_);
            auVar48 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
            auVar88 = ZEXT3264(auVar48);
            auVar48 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
            auVar89 = ZEXT3264(auVar48);
            auVar42 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
            auVar90 = ZEXT1664(auVar42);
            auVar48 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
            auVar91 = ZEXT3264(auVar48);
            auVar48 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
            auVar93 = ZEXT3264(auVar48);
          }
          if (bVar30 == 0) break;
          auVar61._8_4_ = 0x7f800000;
          auVar61._0_8_ = 0x7f8000007f800000;
          auVar61._12_4_ = 0x7f800000;
          auVar42 = vblendmps_avx512vl(auVar61,auVar62._0_16_);
          auVar47._0_4_ =
               (uint)(bVar30 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar30 & 1) * 0x7f800000;
          bVar37 = (bool)(bVar30 >> 1 & 1);
          auVar47._4_4_ = (uint)bVar37 * auVar42._4_4_ | (uint)!bVar37 * 0x7f800000;
          bVar37 = (bool)(bVar30 >> 2 & 1);
          auVar47._8_4_ = (uint)bVar37 * auVar42._8_4_ | (uint)!bVar37 * 0x7f800000;
          auVar47._12_4_ =
               (uint)(bVar30 >> 3) * auVar42._12_4_ | (uint)!(bool)(bVar30 >> 3) * 0x7f800000;
          auVar42 = vshufps_avx(auVar47,auVar47,0xb1);
          auVar42 = vminps_avx(auVar42,auVar47);
          auVar40 = vshufpd_avx(auVar42,auVar42,1);
          auVar42 = vminps_avx(auVar40,auVar42);
          uVar19 = vcmpps_avx512vl(auVar47,auVar42,0);
          bVar31 = (byte)uVar19 & bVar30;
          bVar25 = bVar30;
          if (bVar31 != 0) {
            bVar25 = bVar31;
          }
          uVar32 = 0;
          for (uVar33 = (uint)bVar25; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x80000000) {
            uVar32 = uVar32 + 1;
          }
        } while( true );
      }
    }
  }
  fVar1 = (ray->super_RayK<1>).tfar;
  auVar62 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(fVar1,CONCAT412(fVar1
                                                  ,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))))))));
  goto LAB_01c5dc67;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }